

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::DOMDocumentImpl::setDocumentURI(DOMDocumentImpl *this,XMLCh *documentURI)

{
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  XMLCh *target;
  
  if ((documentURI == (XMLCh *)0x0) || (*documentURI == L'\0')) {
    target = (XMLCh *)0x0;
  }
  else {
    lVar3 = 0x10;
    do {
      lVar1 = lVar3 + -0x10;
      lVar3 = lVar3 + 2;
    } while (*(short *)((long)documentURI + lVar1) != 0);
    iVar2 = (*(this->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])(this);
    target = (XMLCh *)CONCAT44(extraout_var,iVar2);
    XMLString::fixURI(documentURI,target);
  }
  this->fDocumentURI = target;
  return;
}

Assistant:

void DOMDocumentImpl::setDocumentURI(const XMLCh* documentURI){
    if (documentURI && *documentURI) {
        XMLCh* temp = (XMLCh*) this->allocate((XMLString::stringLen(documentURI) + 9)*sizeof(XMLCh));
        XMLString::fixURI(documentURI, temp);
        fDocumentURI = temp;
    }
    else
        fDocumentURI = 0;
}